

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.cpp
# Opt level: O0

void mpp_show_support_format(void)

{
  ulong uVar1;
  MppCodingTypeInfo *info;
  RK_U32 i;
  
  _mpp_log_l(4,"mpi","mpp coding type support list:",(char *)0x0);
  for (info._4_4_ = 0; info._4_4_ < 0x10; info._4_4_ = info._4_4_ + 1) {
    uVar1 = (ulong)info._4_4_;
    _mpp_log_l(4,"mpi","type: %s id %d coding: %-16s id %d\n",(char *)0x0,
               support_list[uVar1].type_name,(ulong)support_list[uVar1].type,
               support_list[uVar1].coding_name,support_list[uVar1].coding);
  }
  return;
}

Assistant:

void mpp_show_support_format()
{
    RK_U32 i = 0;

    mpp_log("mpp coding type support list:");

    for (i = 0; i < MPP_ARRAY_ELEMS(support_list); i++) {
        MppCodingTypeInfo *info = &support_list[i];
        mpp_log("type: %s id %d coding: %-16s id %d\n",
                info->type_name, info->type,
                info->coding_name, info->coding);
    }
}